

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O2

StringTree * __thiscall
kj::StringTree::
concat<kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
          (StringTree *__return_storage_ptr__,StringTree *this,ArrayPtr<const_char> *params,
          StringTree *params_1,ArrayPtr<const_char> *params_2,ArrayPtr<const_char> *params_3,
          ArrayPtr<const_char> *params_4,ArrayPtr<const_char> *params_5,
          ArrayPtr<const_char> *params_6,ArrayPtr<const_char> *params_7,
          ArrayPtr<const_char> *params_8,ArrayPtr<const_char> *params_9,
          ArrayPtr<const_char> *params_10,ArrayPtr<const_char> *params_11,
          ArrayPtr<const_char> *params_12,ArrayPtr<const_char> *params_13)

{
  size_t sVar1;
  size_type extraout_RDX;
  size_type extraout_RDX_00;
  char *pos;
  initializer_list<unsigned_long> nums;
  initializer_list<unsigned_long> nums_00;
  initializer_list<unsigned_long> nums_01;
  Array<kj::StringTree::Branch> local_d8;
  StringTree *local_c0;
  StringTree *local_b8;
  StringTree *local_b0;
  ArrayPtr<const_char> *local_a8;
  char *local_a0;
  char *local_98;
  char *local_90;
  size_t sStack_88;
  size_t local_80;
  size_t sStack_78;
  size_t local_70;
  size_t sStack_68;
  size_t local_60;
  size_t sStack_58;
  size_t local_50;
  size_t sStack_48;
  size_t local_40;
  size_t sStack_38;
  
  (__return_storage_ptr__->branches).size_ = 0;
  (__return_storage_ptr__->branches).disposer = (ArrayDisposer *)0x0;
  (__return_storage_ptr__->text).content.disposer = (ArrayDisposer *)0x0;
  (__return_storage_ptr__->branches).ptr = (Branch *)0x0;
  (__return_storage_ptr__->text).content.ptr = (char *)0x0;
  (__return_storage_ptr__->text).content.size_ = 0;
  local_a0 = (this->text).content.ptr;
  local_98 = params->ptr;
  local_90 = (params_1->text).content.ptr;
  sStack_88 = params_2->size_;
  local_80 = params_3->size_;
  sStack_78 = params_4->size_;
  local_70 = params_5->size_;
  sStack_68 = params_6->size_;
  local_60 = params_7->size_;
  sStack_58 = params_8->size_;
  local_50 = params_9->size_;
  sStack_48 = params_10->size_;
  local_40 = params_11->size_;
  sStack_38 = params_12->size_;
  nums._M_len = (size_type)params;
  nums._M_array = (iterator)0xe;
  local_b8 = (StringTree *)params;
  sVar1 = _::sum((_ *)&local_a0,nums);
  __return_storage_ptr__->size_ = sVar1;
  local_a0 = (this->text).content.ptr;
  local_98 = (char *)0x0;
  local_90 = (params_1->text).content.ptr;
  sStack_88 = params_2->size_;
  local_80 = params_3->size_;
  sStack_78 = params_4->size_;
  local_70 = params_5->size_;
  sStack_68 = params_6->size_;
  local_60 = params_7->size_;
  sStack_58 = params_8->size_;
  local_50 = params_9->size_;
  sStack_48 = params_10->size_;
  local_40 = params_11->size_;
  sStack_38 = params_12->size_;
  nums_00._M_len = extraout_RDX;
  nums_00._M_array = (iterator)0xe;
  local_c0 = this;
  local_b0 = params_1;
  local_a8 = params_2;
  sVar1 = _::sum((_ *)&local_a0,nums_00);
  heapString((String *)&local_d8,sVar1);
  Array<char>::operator=(&(__return_storage_ptr__->text).content,(Array<char> *)&local_d8);
  Array<char>::~Array((Array<char> *)&local_d8);
  local_a0 = (char *)0x0;
  local_98 = (char *)0x1;
  local_90 = (char *)0x0;
  sStack_88 = 0;
  local_80 = 0;
  sStack_78 = 0;
  local_70 = 0;
  sStack_68 = 0;
  local_60 = 0;
  sStack_58 = 0;
  local_50 = 0;
  sStack_48 = 0;
  local_40 = 0;
  sStack_38 = 0;
  nums_01._M_len = extraout_RDX_00;
  nums_01._M_array = (iterator)0xe;
  sVar1 = _::sum((_ *)&local_a0,nums_01);
  local_d8.ptr = _::HeapArrayDisposer::allocate<kj::StringTree::Branch>(sVar1);
  local_d8.disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
  local_d8.size_ = sVar1;
  Array<kj::StringTree::Branch>::operator=(&__return_storage_ptr__->branches,&local_d8);
  Array<kj::StringTree::Branch>::~Array(&local_d8);
  pos = (char *)(__return_storage_ptr__->text).content.size_;
  if (pos != (char *)0x0) {
    pos = (__return_storage_ptr__->text).content.ptr;
  }
  fill<kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,pos,0,(ArrayPtr<const_char> *)local_c0,local_b8,
             (ArrayPtr<const_char> *)local_b0,local_a8,params_3,params_4,params_5,params_6,params_7,
             params_8,params_9,params_10,params_11,params_12);
  return __return_storage_ptr__;
}

Assistant:

StringTree StringTree::concat(Params&&... params) {
  StringTree result;
  result.size_ = _::sum({params.size()...});
  result.text = heapString(
      _::sum({StringTree::flatSize(kj::fwd<Params>(params))...}));
  result.branches = heapArray<StringTree::Branch>(
      _::sum({StringTree::branchCount(kj::fwd<Params>(params))...}));
  result.fill(result.text.begin(), 0, kj::fwd<Params>(params)...);
  return result;
}